

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# minilua.c
# Opt level: O2

int luaD_precall(lua_State *L,StkId func,int nresults)

{
  byte bVar1;
  global_State *pgVar2;
  uint uVar3;
  TValue *pTVar4;
  StkId pTVar5;
  GCObject *pGVar6;
  long lVar7;
  CallInfo *pCVar8;
  ulong uVar9;
  uint uVar10;
  long lVar11;
  CallInfo *pCVar12;
  int *piVar13;
  StkId pTVar14;
  int iVar15;
  long lVar16;
  bool bVar17;
  
  if (func->tt == 6) {
    pGVar6 = (func->value).gc;
  }
  else {
    pTVar4 = luaT_gettmbyobj(L,func,TM_CALL);
    if (pTVar4->tt != 6) {
      luaG_typeerror(L,func,"call");
    }
    pTVar14 = L->stack;
    for (pTVar5 = L->top; func < pTVar5; pTVar5 = pTVar5 + -1) {
      pTVar5->value = pTVar5[-1].value;
      pTVar5->tt = pTVar5[-1].tt;
    }
    pTVar5 = L->top;
    if ((long)L->stack_last - (long)pTVar5 < 0x11) {
      luaD_growstack(L,1);
      pTVar5 = L->top;
    }
    lVar16 = (long)func - (long)pTVar14;
    L->top = pTVar5 + 1;
    pTVar14 = L->stack;
    pGVar6 = (pTVar4->value).gc;
    *(GCObject **)((long)pTVar14 + lVar16) = pGVar6;
    *(int *)((long)pTVar14 + lVar16 + 8) = pTVar4->tt;
    func = (StkId)(lVar16 + (long)pTVar14);
  }
  pTVar14 = L->stack;
  lVar16 = (long)func - (long)pTVar14;
  pCVar8 = L->ci;
  pCVar8->savedpc = L->savedpc;
  if ((pGVar6->h).flags == '\0') {
    pgVar2 = (pGVar6->th).l_G;
    lVar7 = (long)L->stack_last - (long)L->top;
    bVar1 = *(byte *)((long)&pgVar2->GCthreshold + 3);
    lVar11 = (ulong)bVar1 * 0x10;
    if (lVar7 == lVar11 || SBORROW8(lVar7,lVar11) != (long)(lVar7 + (ulong)bVar1 * -0x10) < 0) {
      luaD_growstack(L,(uint)bVar1);
      pTVar14 = L->stack;
    }
    pTVar14 = (StkId)((long)pTVar14 + lVar16);
    if (*(char *)((long)&pgVar2->GCthreshold + 2) == '\0') {
      pTVar5 = pTVar14 + 1;
      if (pTVar14 + (ulong)*(byte *)((long)&pgVar2->GCthreshold + 1) + 1 < L->top) {
        L->top = pTVar14 + (ulong)*(byte *)((long)&pgVar2->GCthreshold + 1) + 1;
      }
    }
    else {
      bVar1 = *(byte *)((long)&pgVar2->GCthreshold + 1);
      uVar9 = (ulong)bVar1;
      uVar10 = (int)((ulong)((long)L->top - (long)pTVar14) >> 4) - 1;
      pTVar5 = L->top;
      for (uVar3 = uVar10; (int)uVar3 < (int)(uint)bVar1; uVar3 = uVar3 + 1) {
        L->top = pTVar5 + 1;
        pTVar5->tt = 0;
        pTVar5 = pTVar5 + 1;
      }
      uVar3 = (uint)bVar1;
      if ((int)(uint)bVar1 < (int)uVar10) {
        uVar3 = uVar10;
      }
      piVar13 = &pTVar5[-(ulong)uVar3].tt;
      while (bVar17 = uVar9 != 0, uVar9 = uVar9 - 1, bVar17) {
        pTVar14 = L->top;
        L->top = pTVar14 + 1;
        pTVar14->value = ((TValue *)(piVar13 + -2))->value;
        pTVar14->tt = *piVar13;
        *piVar13 = 0;
        piVar13 = piVar13 + 4;
      }
      pTVar14 = (StkId)(lVar16 + (long)L->stack);
    }
    if (L->ci == L->end_ci) {
      pCVar8 = growCI(L);
    }
    else {
      pCVar8 = L->ci + 1;
      L->ci = pCVar8;
    }
    pCVar8->func = pTVar14;
    pCVar8->base = pTVar5;
    L->base = pTVar5;
    pTVar5 = pTVar5 + *(byte *)((long)&pgVar2->GCthreshold + 3);
    pCVar8->top = pTVar5;
    L->savedpc = (Instruction *)pgVar2->ud;
    pCVar8->tailcalls = 0;
    pCVar8->nresults = nresults;
    for (pTVar14 = L->top; pTVar14 < pTVar5; pTVar14 = pTVar14 + 1) {
      pTVar14->tt = 0;
    }
    L->top = pTVar5;
    iVar15 = 0;
  }
  else {
    if ((long)L->stack_last - (long)L->top < 0x141) {
      luaD_growstack(L,0x14);
      pCVar8 = L->ci;
    }
    if (pCVar8 == L->end_ci) {
      pCVar8 = growCI(L);
      pCVar12 = L->ci;
    }
    else {
      pCVar8 = pCVar8 + 1;
      L->ci = pCVar8;
      pCVar12 = pCVar8;
    }
    pTVar14 = L->stack;
    pCVar8->func = (StkId)((long)pTVar14 + lVar16);
    pTVar14 = (StkId)((long)pTVar14 + lVar16 + 0x10);
    pCVar8->base = pTVar14;
    L->base = pTVar14;
    pCVar8->top = L->top + 0x14;
    pCVar8->nresults = nresults;
    uVar3 = (*(code *)(((pCVar12->func->value).gc)->h).node)(L);
    if ((int)uVar3 < 0) {
      iVar15 = 2;
    }
    else {
      iVar15 = 1;
      luaD_poscall(L,L->top + -(ulong)uVar3);
    }
  }
  return iVar15;
}

Assistant:

static int luaD_precall(lua_State*L,StkId func,int nresults){
LClosure*cl;
ptrdiff_t funcr;
if(!ttisfunction(func))
func=tryfuncTM(L,func);
funcr=savestack(L,func);
cl=&clvalue(func)->l;
L->ci->savedpc=L->savedpc;
if(!cl->isC){
CallInfo*ci;
StkId st,base;
Proto*p=cl->p;
luaD_checkstack(L,p->maxstacksize);
func=restorestack(L,funcr);
if(!p->is_vararg){
base=func+1;
if(L->top>base+p->numparams)
L->top=base+p->numparams;
}
else{
int nargs=cast_int(L->top-func)-1;
base=adjust_varargs(L,p,nargs);
func=restorestack(L,funcr);
}
ci=inc_ci(L);
ci->func=func;
L->base=ci->base=base;
ci->top=L->base+p->maxstacksize;
L->savedpc=p->code;
ci->tailcalls=0;
ci->nresults=nresults;
for(st=L->top;st<ci->top;st++)
setnilvalue(st);
L->top=ci->top;
return 0;
}
else{
CallInfo*ci;
int n;
luaD_checkstack(L,20);
ci=inc_ci(L);
ci->func=restorestack(L,funcr);
L->base=ci->base=ci->func+1;
ci->top=L->top+20;
ci->nresults=nresults;
n=(*curr_func(L)->c.f)(L);
if(n<0)
return 2;
else{
luaD_poscall(L,L->top-n);
return 1;
}
}
}